

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

char * bcf_hdr_fmt_text(bcf_hdr_t *hdr,int is_bcf,int *len)

{
  undefined1 local_40 [8];
  kstring_t txt;
  int i;
  int *len_local;
  int is_bcf_local;
  bcf_hdr_t *hdr_local;
  
  memset(local_40,0,0x18);
  for (txt.s._4_4_ = 0; txt.s._4_4_ < hdr->nhrec; txt.s._4_4_ = txt.s._4_4_ + 1) {
    _bcf_hrec_format(hdr->hrec[txt.s._4_4_],is_bcf,(kstring_t *)local_40);
  }
  ksprintf((kstring_t *)local_40,"#CHROM\tPOS\tID\tREF\tALT\tQUAL\tFILTER\tINFO");
  if (hdr->n[2] != 0) {
    ksprintf((kstring_t *)local_40,"\tFORMAT");
    for (txt.s._4_4_ = 0; txt.s._4_4_ < hdr->n[2]; txt.s._4_4_ = txt.s._4_4_ + 1) {
      ksprintf((kstring_t *)local_40,"\t%s",hdr->samples[txt.s._4_4_]);
    }
  }
  ksprintf((kstring_t *)local_40,"\n");
  if (len != (int *)0x0) {
    *len = local_40._0_4_;
  }
  return (char *)txt.m;
}

Assistant:

char *bcf_hdr_fmt_text(const bcf_hdr_t *hdr, int is_bcf, int *len)
{
    int i;
    kstring_t txt = {0,0,0};
    for (i=0; i<hdr->nhrec; i++)
        _bcf_hrec_format(hdr->hrec[i], is_bcf, &txt);

    ksprintf(&txt,"#CHROM\tPOS\tID\tREF\tALT\tQUAL\tFILTER\tINFO");
    if ( bcf_hdr_nsamples(hdr) )
    {
        ksprintf(&txt,"\tFORMAT");
        for (i=0; i<bcf_hdr_nsamples(hdr); i++)
            ksprintf(&txt,"\t%s", hdr->samples[i]);
    }
    ksprintf(&txt,"\n");

    if ( len ) *len = txt.l;
    return txt.s;
}